

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O0

void __thiscall google::protobuf::io::Tokenizer::~Tokenizer(Tokenizer *this)

{
  Tokenizer *this_local;
  
  if (this->buffer_pos_ < this->buffer_size_) {
    (*this->input_->_vptr_ZeroCopyInputStream[3])
              (this->input_,(ulong)(uint)(this->buffer_size_ - this->buffer_pos_));
  }
  Token::~Token(&this->previous_);
  Token::~Token(&this->current_);
  return;
}

Assistant:

Tokenizer::~Tokenizer() {
  // If we had any buffer left unread, return it to the underlying stream
  // so that someone else can read it.
  if (buffer_size_ > buffer_pos_) {
    input_->BackUp(buffer_size_ - buffer_pos_);
  }
}